

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubDEdgeSharpness::SetEdgeChainSharpness
          (ON_SubDEdgeSharpness *this,ON_Interval chain_sharpness_range,uint edge_count,
          ON_SubDEdgeSharpness *chain_edge_sharpness)

{
  double dVar1;
  ON_SubDEdgeSharpness OVar2;
  bool bVar3;
  double *pdVar4;
  ulong uVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  float *pfVar7;
  uint uVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  ON_Interval chain_sharpness_range_local;
  ON_Interval r;
  ON_SubDEdgeSharpness v;
  ulong uVar9;
  
  pfVar7 = (float *)CONCAT44(in_register_00000034,edge_count);
  chain_sharpness_range_local.m_t[1] = chain_sharpness_range.m_t[1];
  uVar9 = (ulong)this & 0xffffffff;
  uVar8 = (uint)this;
  chain_sharpness_range_local.m_t[0] = chain_sharpness_range.m_t[0];
  uVar6 = 0;
  if (pfVar7 != (float *)0x0 && 1 < uVar8 + 1) {
    uVar6 = 0;
    pdVar4 = ON_Interval::operator[](&chain_sharpness_range_local,0);
    dVar1 = *pdVar4;
    pdVar4 = ON_Interval::operator[](&chain_sharpness_range_local,1);
    if ((dVar1 != *pdVar4) || (NAN(dVar1) || NAN(*pdVar4))) {
      pdVar4 = ON_Interval::operator[](&chain_sharpness_range_local,0);
      if ((0.0 <= *pdVar4) && (*pdVar4 <= 4.0)) {
        pdVar4 = ON_Interval::operator[](&chain_sharpness_range_local,1);
        dVar1 = ON_DBL_QNAN;
        if ((0.0 <= *pdVar4) && (*pdVar4 <= 4.0)) {
          pdVar4 = ON_Interval::operator[](&chain_sharpness_range_local,0);
          ON_Interval::ON_Interval(&r,dVar1,*pdVar4);
          for (uVar5 = 1; uVar8 + 1 != uVar5; uVar5 = uVar5 + 1) {
            r.m_t[0] = r.m_t[1];
            if (uVar5 < uVar9) {
              dVar1 = ON_Interval::ParameterAt
                                (&chain_sharpness_range_local,
                                 (double)(uVar5 & 0xffffffff) / (double)uVar9);
              uVar10 = SUB84(dVar1,0);
              uVar11 = (undefined4)((ulong)dVar1 >> 0x20);
            }
            else {
              pdVar4 = ON_Interval::operator[](&chain_sharpness_range_local,1);
              uVar10 = SUB84(*pdVar4,0);
              uVar11 = (undefined4)((ulong)*pdVar4 >> 0x20);
            }
            r.m_t[1] = (double)CONCAT44(uVar11,uVar10);
            OVar2 = FromInterval(&r);
            v.m_edge_sharpness = OVar2.m_edge_sharpness;
            bVar3 = IsValid(&v);
            if (!bVar3) {
              return 0;
            }
            *(float (*) [2])(pfVar7 + uVar5 * 2 + -2) = OVar2.m_edge_sharpness;
          }
          uVar6 = 1;
          if (*pfVar7 != pfVar7[(ulong)(uVar8 - 1) * 2 + 1]) {
            uVar6 = uVar8;
          }
          if (NAN(*pfVar7) || NAN(pfVar7[(ulong)(uVar8 - 1) * 2 + 1])) {
            uVar6 = uVar8;
          }
        }
      }
    }
    else {
      pdVar4 = ON_Interval::operator[](&chain_sharpness_range_local,0);
      OVar2 = FromConstant(*pdVar4);
      r.m_t[0] = (double)OVar2;
      bVar3 = IsValid((ON_SubDEdgeSharpness *)&r,true);
      uVar6 = 0;
      if (bVar3) {
        for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
          *(float (*) [2])(pfVar7 + uVar5 * 2) = OVar2.m_edge_sharpness;
        }
        uVar6 = 1;
      }
    }
  }
  return uVar6;
}

Assistant:

unsigned ON_SubDEdgeSharpness::SetEdgeChainSharpness(
  ON_Interval chain_sharpness_range,
  unsigned edge_count,
  ON_SubDEdgeSharpness* chain_edge_sharpness
)
{
  if (edge_count <= 0 || edge_count >= ON_UNSET_UINT_INDEX || nullptr == chain_edge_sharpness)
    return 0;

  if (chain_sharpness_range[0] == chain_sharpness_range[1])
  {
    const ON_SubDEdgeSharpness c = ON_SubDEdgeSharpness::FromConstant(chain_sharpness_range[0]);
    if (false == c.IsValid(true))
      return 0;
    for (unsigned i = 0; i < edge_count; ++i)
      chain_edge_sharpness[i] = c;
    return 1;
  }

  if (false == ON_SubDEdgeSharpness::IsValidValue(chain_sharpness_range[0], false))
    return false;
  if (false == ON_SubDEdgeSharpness::IsValidValue(chain_sharpness_range[1], false))
    return false;

  const double d = (double)edge_count;
  ON_Interval r(ON_DBL_QNAN, chain_sharpness_range[0]);
  for (unsigned i = 1; i <= edge_count; ++i)
  {
    r.m_t[0] = r.m_t[1];
    r.m_t[1]
      = (i < edge_count)
      ? chain_sharpness_range.ParameterAt(((double)i / d))
      : chain_sharpness_range[1];
    const ON_SubDEdgeSharpness v = ON_SubDEdgeSharpness::FromInterval(r);
    if (v.IsValid())
    {
      chain_edge_sharpness[i - 1] = v;
      continue;
    }
    return 0;
  }

  return
    (chain_edge_sharpness[0].EndSharpness(0) != chain_edge_sharpness[edge_count - 1].EndSharpness(1))
    ? edge_count
    : 1;
}